

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initStructList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,StructSize elementSize)

{
  uint uVar1;
  unsigned_long uVar2;
  undefined8 extraout_RAX;
  word *pwVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  CapTableBuilder *local_38;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  local_38 = capTable;
  uVar1 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                    (elementCount,&local_39);
  uVar2 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                    ((ulong)(((uint)elementSize & 0xffff) + ((uint)elementSize >> 0x10)) *
                     (ulong)uVar1,&local_3a);
  if (arena != (BuilderArena *)0x0) {
    AVar4 = BuilderArena::allocate(arena,(int)uVar2 + 1);
    pwVar3 = AVar4.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)uVar2 * 8 + 7;
    *(uint *)&pwVar3->content = uVar1 << 2;
    *(StructDataWordCount *)((long)&pwVar3->content + 4) = elementSize.data;
    *(StructPointerCount *)((long)&pwVar3->content + 6) = elementSize.pointers;
    __return_storage_ptr__->segment = AVar4.segment;
    __return_storage_ptr__->capTable = local_38;
    __return_storage_ptr__->location = pwVar3;
    return __return_storage_ptr__;
  }
  WireHelpers::zeroObject((SegmentBuilder *)0x0,local_38,(WirePointer *)__return_storage_ptr__);
  ~OrphanBuilder(__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

OrphanBuilder OrphanBuilder::initStructList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, StructSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initStructListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}